

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_tostring(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *o;
  SQRESULT SVar2;
  SQObjectPtr res;
  SQObjectPtr local_20;
  
  if (idx < 0) {
    o = SQVM::GetUp(v,idx);
  }
  else {
    o = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  local_20.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_20.super_SQObject._type = OT_NULL;
  bVar1 = SQVM::ToString(v,o,&local_20);
  SVar2 = -1;
  if (bVar1) {
    SQVM::Push(v,&local_20);
    SVar2 = 0;
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return SVar2;
}

Assistant:

SQRESULT sq_tostring(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    SQObjectPtr res;
    if(!v->ToString(o,res)) {
        return SQ_ERROR;
    }
    v->Push(res);
    return SQ_OK;
}